

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall
BCLog::Logger::FormatLogStrInPlace
          (Logger *this,string *str,LogFlags category,Level level,string_view source_file,
          int source_line,string_view logging_function,string_view threadname,time_point now,
          seconds mocktime)

{
  string_view prefix;
  string_view str_00;
  bool bVar1;
  Logger *in_RDX;
  Logger *in_RSI;
  LogFlags in_RDI;
  rep in_R8;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe90;
  Logger *in_stack_fffffffffffffe98;
  Logger *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *fmt;
  seconds in_stack_ffffffffffffff30;
  time_point in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  long local_8;
  
  args = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000020;
  fmt = &stack0x00000010;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetLogPrefix_abi_cxx11_(in_RSI,in_RDI,(Level)((ulong)fmt >> 0x20));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  if ((*(byte *)(in_RDI + (RPC|WALLETDB|BENCH|MEMPOOL|NET)) & 1) != 0) {
    in_stack_fffffffffffffea0 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    str_00._M_str._0_4_ = (int)fmt;
    str_00._M_len = (size_t)args;
    str_00._M_str._4_4_ = (int)((ulong)fmt >> 0x20);
    prefix._M_str = (char *)in_stack_fffffffffffffea8;
    prefix._M_len = (size_t)in_stack_fffffffffffffea0;
    util::RemovePrefixView(str_00,prefix);
    in_stack_fffffffffffffea8 = local_48;
    tinyformat::
    format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>>
              (fmt,args,(int *)in_stack_fffffffffffffea8,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    in_stack_ffffffffffffff38.__d.__r = (duration)(duration)in_R8;
  }
  if ((*(byte *)(in_RDI + (RPC|WALLETDB|BENCH|MEMPOOL)) & 1) != 0) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78
                      );
    in_stack_fffffffffffffe98 = in_RSI;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
                 in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe98 = in_RSI;
    }
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
              ((char *)in_stack_fffffffffffffea8,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffea0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  }
  LogTimestampStr_abi_cxx11_(in_RDX,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BCLog::Logger::FormatLogStrInPlace(std::string& str, BCLog::LogFlags category, BCLog::Level level, std::string_view source_file, int source_line, std::string_view logging_function, std::string_view threadname, SystemClock::time_point now, std::chrono::seconds mocktime) const
{
    str.insert(0, GetLogPrefix(category, level));

    if (m_log_sourcelocations) {
        str.insert(0, strprintf("[%s:%d] [%s] ", RemovePrefixView(source_file, "./"), source_line, logging_function));
    }

    if (m_log_threadnames) {
        str.insert(0, strprintf("[%s] ", (threadname.empty() ? "unknown" : threadname)));
    }

    str.insert(0, LogTimestampStr(now, mocktime));
}